

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

void duckdb::MergeUpdateLoop<signed_char>
               (UpdateInfo *base_info,Vector *base_data,UpdateInfo *update_info,
               UnifiedVectorFormat *update,row_t *ids,idx_t count,SelectionVector *sel)

{
  UpdateInfo *__dest;
  uint uVar1;
  uint uVar2;
  sel_t sVar3;
  void *__dest_00;
  void *__dest_01;
  long lVar4;
  long lVar5;
  anon_class_40_5_fa23cdf1 *count_00;
  ulong uVar6;
  idx_t i;
  ulong uVar7;
  size_t sVar8;
  long lVar9;
  idx_t id;
  ulong uVar10;
  data_t *pdVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  UpdateInfo *pUVar16;
  char result_values [2048];
  sel_t result_ids [2048];
  idx_t local_28a8;
  UpdateInfo *local_28a0;
  UpdateInfo *local_2898;
  long local_2890;
  UpdateInfo *local_2888;
  SelectionVector *local_2880;
  data_ptr_t local_2878;
  sel_t *local_2870;
  data_ptr_t local_2868;
  anon_class_40_5_fa23cdf1 local_2860;
  data_t local_2838 [2048];
  sel_t local_2038 [2050];
  
  local_2878 = base_data->data;
  local_2880 = update->sel;
  local_2868 = update->data;
  lVar5 = base_info->vector_index * 0x800 + base_info->segment->column_data->start;
  __dest = base_info + 1;
  __dest_00 = (void *)((long)&base_info[1].segment + (ulong)base_info->max * 4);
  local_2898 = update_info + 1;
  __dest_01 = (void *)((long)&update_info[1].segment + (ulong)update_info->max * 4);
  local_2890 = (ulong)update_info->max * 4;
  local_2870 = sel->sel_vector;
  uVar1 = update_info->N;
  uVar14 = (ulong)base_info->N;
  lVar4 = 0;
  uVar7 = 0;
  uVar15 = 0;
  uVar12 = 0;
  while( true ) {
    if (uVar7 == count) break;
    uVar6 = uVar7;
    if (local_2870 != (sel_t *)0x0) {
      uVar6 = (ulong)local_2870[uVar7];
    }
    uVar6 = ids[uVar6] - lVar5;
    for (lVar9 = 0; lVar9 + uVar15 < (ulong)uVar1; lVar9 = lVar9 + 1) {
      uVar2 = *(uint *)((long)&local_2898->segment + lVar9 * 4 + uVar15 * 4);
      if (uVar6 <= uVar2) {
        if (uVar6 == uVar2) {
          local_2838[lVar9 + lVar4] = *(data_t *)((long)__dest_01 + lVar9 + uVar15);
          local_2038[lVar4 + lVar9] = uVar2;
          uVar13 = uVar12;
          uVar15 = lVar9 + uVar15 + 1;
          goto LAB_00539a8e;
        }
        break;
      }
      local_2838[lVar9 + lVar4] = *(data_t *)((long)__dest_01 + lVar9 + uVar15);
      local_2038[lVar4 + lVar9] = uVar2;
    }
    uVar13 = uVar14;
    if (uVar14 < uVar12) {
      uVar13 = uVar12;
    }
    for (; uVar12 < uVar14; uVar12 = uVar12 + 1) {
      uVar10 = (ulong)*(uint *)((long)&__dest->segment + uVar12 * 4);
      if (uVar6 <= uVar10) {
        uVar13 = uVar12;
        if (uVar6 == uVar10) {
          pdVar11 = (data_t *)((long)__dest_00 + uVar12);
          goto LAB_00539a83;
        }
        break;
      }
    }
    pdVar11 = local_2878 + uVar6;
LAB_00539a83:
    local_2838[lVar9 + lVar4] = *pdVar11;
    local_2038[lVar4 + lVar9] = (sel_t)uVar6;
    uVar15 = lVar9 + uVar15;
LAB_00539a8e:
    lVar4 = lVar4 + lVar9 + 1;
    uVar7 = uVar7 + 1;
    uVar12 = uVar13;
  }
  sVar8 = lVar4 * 4;
  for (lVar9 = 0; lVar9 + uVar15 < (ulong)uVar1; lVar9 = lVar9 + 1) {
    local_2838[lVar9 + lVar4] =
         *(data_t *)((long)&update_info[1].segment + lVar9 + uVar15 + local_2890);
    local_2038[lVar4 + lVar9] = *(sel_t *)((long)&update_info[1].segment + lVar9 * 4 + uVar15 * 4);
    sVar8 = sVar8 + 4;
  }
  update_info->N = (sel_t)(lVar4 + lVar9);
  local_28a0 = base_info;
  local_2888 = update_info;
  switchD_00916250::default(__dest_01,(char (*) [2048])local_2838,lVar4 + lVar9);
  switchD_00916250::default(local_2898,(sel_t (*) [2048])local_2038,sVar8);
  local_2860.result_offset = &local_28a8;
  local_28a8 = 0;
  count_00 = &local_2860;
  local_2860.update_vector_data = (char **)&local_2868;
  local_2860.update_vector_sel = local_2880;
  uVar1 = local_28a0->N;
  uVar12 = 0;
  uVar15 = 0;
  pUVar16 = __dest;
  local_2860.result_values = (char (*) [2048])local_2838;
  local_2860.result_ids = (sel_t (*) [2048])local_2038;
  do {
    while( true ) {
      if ((count <= uVar15) || (uVar1 <= uVar12)) {
        for (; uVar15 < count; uVar15 = uVar15 + 1) {
          uVar7 = uVar15;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar7 = (ulong)sel->sel_vector[uVar15];
          }
          MergeUpdateLoopInternal<signed_char,_signed_char,_duckdb::ExtractStandardEntry>::
          anon_class_40_5_fa23cdf1::operator()(&local_2860,ids[uVar7] - lVar5,uVar7,(idx_t)count_00)
          ;
        }
        sVar8 = local_28a8 * 4;
        for (lVar4 = 0; lVar4 + uVar12 < (ulong)uVar1; lVar4 = lVar4 + 1) {
          sVar3 = *(sel_t *)&pUVar16->segment;
          local_2838[lVar4 + local_28a8] = *(data_t *)((long)__dest_00 + lVar4 + uVar12);
          local_2038[local_28a8 + lVar4] = sVar3;
          sVar8 = sVar8 + 4;
          pUVar16 = (UpdateInfo *)((long)&pUVar16->segment + 4);
        }
        local_28a0->N = (sel_t)(local_28a8 + lVar4);
        switchD_00916250::default(__dest_00,local_2838,local_28a8 + lVar4);
        switchD_00916250::default(__dest,local_2038,sVar8);
        return;
      }
      uVar7 = uVar15;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar7 = (ulong)sel->sel_vector[uVar15];
      }
      id = ids[uVar7] - lVar5;
      uVar2 = *(uint *)((long)&__dest->segment + uVar12 * 4);
      if (id != uVar2) break;
      MergeUpdateLoopInternal<signed_char,_signed_char,_duckdb::ExtractStandardEntry>::
      anon_class_40_5_fa23cdf1::operator()(&local_2860,id,uVar7,(idx_t)count_00);
      uVar15 = uVar15 + 1;
LAB_00539be3:
      uVar12 = uVar12 + 1;
      pUVar16 = (UpdateInfo *)((long)&pUVar16->segment + 4);
    }
    if (uVar2 <= id) {
      count_00 = (anon_class_40_5_fa23cdf1 *)
                 CONCAT71((int7)((ulong)__dest_00 >> 8),*(data_t *)((long)__dest_00 + uVar12));
      local_2838[local_28a8] = *(data_t *)((long)__dest_00 + uVar12);
      local_2038[local_28a8] = uVar2;
      local_28a8 = local_28a8 + 1;
      goto LAB_00539be3;
    }
    MergeUpdateLoopInternal<signed_char,_signed_char,_duckdb::ExtractStandardEntry>::
    anon_class_40_5_fa23cdf1::operator()(&local_2860,id,uVar7,(idx_t)count_00);
    uVar15 = uVar15 + 1;
  } while( true );
}

Assistant:

static void MergeUpdateLoop(UpdateInfo &base_info, Vector &base_data, UpdateInfo &update_info,
                            UnifiedVectorFormat &update, row_t *ids, idx_t count, const SelectionVector &sel) {
	auto base_table_data = FlatVector::GetData<T>(base_data);
	auto update_vector_data = update.GetData<T>(update);
	MergeUpdateLoopInternal<T, T>(base_info, base_table_data, update_info, *update.sel, update_vector_data, ids, count,
	                              sel);
}